

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicArray.hpp
# Opt level: O0

void __thiscall
stick::DynamicArray<stick::String>::reserve(DynamicArray<stick::String> *this,Size _s)

{
  void *pvVar1;
  String *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  void *extraout_RDX;
  ulong local_50;
  Size i_1;
  Size i;
  String *sourcePtr;
  String *arrayPtr;
  Block blk;
  Size c;
  Size _s_local;
  DynamicArray<stick::String> *this_local;
  
  blk.size = capacity(this);
  if (blk.size < _s) {
    if (this->m_allocator == (Allocator *)0x0) {
      __assert_fail("m_allocator",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/DynamicArray.hpp"
                    ,0x87,
                    "void stick::DynamicArray<stick::String>::reserve(Size) [T = stick::String]");
    }
    iVar4 = (*this->m_allocator->_vptr_Allocator[2])(this->m_allocator,_s << 5,8);
    arrayPtr = (String *)CONCAT44(extraout_var,iVar4);
    blk.ptr = extraout_RDX;
    bVar3 = mem::Block::operator_cast_to_bool((Block *)&arrayPtr);
    pSVar2 = arrayPtr;
    if (!bVar3) {
      __assert_fail("blk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/DynamicArray.hpp"
                    ,0x89,
                    "void stick::DynamicArray<stick::String>::reserve(Size) [T = stick::String]");
    }
    pvVar1 = (this->m_data).ptr;
    for (i_1 = 0; i_1 < this->m_count; i_1 = i_1 + 1) {
      String::String(pSVar2 + i_1,(String *)((long)pvVar1 + i_1 * 0x20));
    }
    for (local_50 = 0; local_50 < this->m_count; local_50 = local_50 + 1) {
      String::~String((String *)((long)pvVar1 + local_50 * 0x20));
    }
    bVar3 = mem::Block::operator_cast_to_bool(&this->m_data);
    if (bVar3) {
      (*this->m_allocator->_vptr_Allocator[3])();
    }
    (this->m_data).ptr = arrayPtr;
    (this->m_data).size = (Size)blk.ptr;
  }
  return;
}

Assistant:

inline void reserve(Size _s)
    {
        auto c = capacity();
        if (_s > c)
        {
            STICK_ASSERT(m_allocator);
            auto blk = m_allocator->allocate(_s * sizeof(T), alignof(T));
            STICK_ASSERT(blk);
            T * arrayPtr = reinterpret_cast<T *>(blk.ptr);
            T * sourcePtr = reinterpret_cast<T *>(m_data.ptr);

            // move the existing elements over
            for (Size i = 0; i < m_count; ++i)
            {
                new (arrayPtr + i) T(std::move(sourcePtr[i]));
            }

            // call the destructors on the old elements
            for (Size i = 0; i < m_count; ++i)
            {
                sourcePtr[i].~T();
            }

            if (m_data)
                m_allocator->deallocate(m_data);

            m_data = blk;
        }
    }